

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise_x86_avx::forward
          (Eltwise_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  Mat *m;
  Mat *this_00;
  pointer pMVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  _func_int *p_Var13;
  int iVar14;
  int iVar15;
  Mat *pMVar16;
  size_t b;
  ulong uVar17;
  int q_3;
  int iVar18;
  pointer pMVar19;
  int q;
  int iVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar32 [64];
  Mat local_e0;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar20 = m->elempack;
  iVar11 = m->c;
  iVar10 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar18 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var13 = this->_vptr_Eltwise_x86_avx[-3];
    iVar18 = *(int *)(&this->field_0xd0 + (long)p_Var13);
    if (iVar20 == 4) {
      if (iVar18 == 0) {
        local_78 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start + 1;
        pMVar19 = (pointer)0x0;
        iVar20 = 0;
        if (0 < iVar10) {
          iVar20 = iVar10;
        }
        iVar18 = 0;
        if (0 < iVar11) {
          iVar18 = iVar11;
        }
        while (iVar14 = (int)pMVar19, iVar14 != iVar18) {
          Mat::channel(&local_e0,m,iVar14);
          pvVar7 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,local_78,iVar14);
          pvVar8 = local_e0.data;
          Mat::~Mat(&local_e0);
          local_98 = pMVar19;
          Mat::channel(&local_e0,this_00,iVar14);
          pvVar9 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar12 = 0;
          iVar14 = iVar20;
          while (bVar21 = iVar14 != 0, iVar14 = iVar14 + -1, bVar21) {
            pfVar1 = (float *)((long)pvVar8 + lVar12);
            pfVar2 = (float *)((long)pvVar7 + lVar12);
            auVar22._0_4_ = *pfVar1 * *pfVar2;
            auVar22._4_4_ = pfVar1[1] * pfVar2[1];
            auVar22._8_4_ = pfVar1[2] * pfVar2[2];
            auVar22._12_4_ = pfVar1[3] * pfVar2[3];
            *(undefined1 (*) [16])((long)pvVar9 + lVar12) = auVar22;
            lVar12 = lVar12 + 0x10;
          }
          pMVar19 = (pointer)(ulong)((int)local_98 + 1);
        }
        pMVar19 = (pointer)0x2;
        while (pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start,
              pMVar19 < (pointer)(((long)(bottom_blobs->
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) /
                                 0x48)) {
          local_98 = pMVar19;
          for (iVar14 = 0; iVar14 != iVar18; iVar14 = iVar14 + 1) {
            Mat::channel(&local_e0,pMVar4 + (long)pMVar19,iVar14);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar14);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            iVar15 = iVar20;
            while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
              pfVar1 = (float *)((long)pvVar7 + lVar12);
              pfVar2 = (float *)((long)pvVar8 + lVar12);
              auVar23._0_4_ = *pfVar1 * *pfVar2;
              auVar23._4_4_ = pfVar1[1] * pfVar2[1];
              auVar23._8_4_ = pfVar1[2] * pfVar2[2];
              auVar23._12_4_ = pfVar1[3] * pfVar2[3];
              *(undefined1 (*) [16])((long)pvVar8 + lVar12) = auVar23;
              lVar12 = lVar12 + 0x10;
            }
          }
          pMVar19 = (pointer)((long)&local_98->data + 1);
        }
        p_Var13 = this->_vptr_Eltwise_x86_avx[-3];
        iVar18 = *(int *)(&this->field_0xd0 + (long)p_Var13);
      }
      if (iVar18 == 1) {
        local_98 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start + 1;
        if (*(int *)(&this->field_0x104 + (long)p_Var13) == 0) {
          iVar20 = 0;
          if (0 < iVar10) {
            iVar20 = iVar10;
          }
          iVar18 = 0;
          iVar14 = 0;
          if (0 < iVar11) {
            iVar18 = iVar11;
            iVar14 = 0;
          }
          for (; iVar14 != iVar18; iVar14 = iVar14 + 1) {
            Mat::channel(&local_e0,m,iVar14);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,local_98,iVar14);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar14);
            pvVar9 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            iVar15 = iVar20;
            while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
              pfVar1 = (float *)((long)pvVar8 + lVar12);
              pfVar2 = (float *)((long)pvVar7 + lVar12);
              auVar26._0_4_ = *pfVar1 + *pfVar2;
              auVar26._4_4_ = pfVar1[1] + pfVar2[1];
              auVar26._8_4_ = pfVar1[2] + pfVar2[2];
              auVar26._12_4_ = pfVar1[3] + pfVar2[3];
              *(undefined1 (*) [16])((long)pvVar9 + lVar12) = auVar26;
              lVar12 = lVar12 + 0x10;
            }
          }
          pMVar19 = (pointer)0x2;
          while (pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                pMVar19 < (pointer)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pMVar4) / 0x48)) {
            local_98 = pMVar19;
            for (iVar14 = 0; iVar14 != iVar18; iVar14 = iVar14 + 1) {
              Mat::channel(&local_e0,pMVar4 + (long)pMVar19,iVar14);
              pvVar7 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,iVar14);
              pvVar8 = local_e0.data;
              Mat::~Mat(&local_e0);
              lVar12 = 0;
              iVar15 = iVar20;
              while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
                pfVar1 = (float *)((long)pvVar7 + lVar12);
                pfVar2 = (float *)((long)pvVar8 + lVar12);
                auVar27._0_4_ = *pfVar1 + *pfVar2;
                auVar27._4_4_ = pfVar1[1] + pfVar2[1];
                auVar27._8_4_ = pfVar1[2] + pfVar2[2];
                auVar27._12_4_ = pfVar1[3] + pfVar2[3];
                *(undefined1 (*) [16])((long)pvVar8 + lVar12) = auVar27;
                lVar12 = lVar12 + 0x10;
              }
            }
            pMVar19 = (pointer)((long)&local_98->data + 1);
          }
        }
        else {
          fStack_70 = **(float **)(&this->field_0xd8 + (long)p_Var13);
          local_58 = (*(float **)(&this->field_0xd8 + (long)p_Var13))[1];
          iVar18 = 0;
          iVar20 = 0;
          if (0 < iVar10) {
            iVar20 = iVar10;
          }
          iVar14 = 0;
          if (0 < iVar11) {
            iVar14 = iVar11;
          }
          local_78 = (pointer)CONCAT44(fStack_70,fStack_70);
          fStack_6c = fStack_70;
          fStack_54 = local_58;
          fStack_50 = local_58;
          fStack_4c = local_58;
          for (; pMVar16 = local_98, iVar18 != iVar14; iVar18 = iVar18 + 1) {
            Mat::channel(&local_e0,m,iVar18);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,pMVar16,iVar18);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar18);
            pvVar9 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            iVar15 = iVar20;
            while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
              pfVar2 = (float *)((long)pvVar7 + lVar12);
              pfVar1 = (float *)((long)pvVar8 + lVar12);
              auVar24._0_4_ = local_58 * *pfVar1 + (float)local_78 * *pfVar2;
              auVar24._4_4_ = fStack_54 * pfVar1[1] + local_78._4_4_ * pfVar2[1];
              auVar24._8_4_ = fStack_50 * pfVar1[2] + fStack_70 * pfVar2[2];
              auVar24._12_4_ = fStack_4c * pfVar1[3] + fStack_6c * pfVar2[3];
              *(undefined1 (*) [16])((long)pvVar9 + lVar12) = auVar24;
              lVar12 = lVar12 + 0x10;
            }
          }
          pMVar19 = (pointer)0x2;
          while (pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                pMVar19 < (pointer)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pMVar4) / 0x48)) {
            fStack_90 = *(float *)(*(long *)(&this->field_0xd8 +
                                            (long)this->_vptr_Eltwise_x86_avx[-3]) +
                                  (long)pMVar19 * 4);
            local_98 = (pointer)CONCAT44(fStack_90,fStack_90);
            fStack_8c = fStack_90;
            local_78 = pMVar19;
            for (iVar18 = 0; iVar18 != iVar14; iVar18 = iVar18 + 1) {
              Mat::channel(&local_e0,pMVar4 + (long)pMVar19,iVar18);
              pvVar7 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,iVar18);
              pvVar8 = local_e0.data;
              Mat::~Mat(&local_e0);
              lVar12 = 0;
              iVar15 = iVar20;
              while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
                pfVar1 = (float *)((long)pvVar7 + lVar12);
                pfVar2 = (float *)((long)pvVar8 + lVar12);
                auVar25._0_4_ = (float)local_98 * *pfVar1 + *pfVar2;
                auVar25._4_4_ = local_98._4_4_ * pfVar1[1] + pfVar2[1];
                auVar25._8_4_ = fStack_90 * pfVar1[2] + pfVar2[2];
                auVar25._12_4_ = fStack_8c * pfVar1[3] + pfVar2[3];
                *(undefined1 (*) [16])((long)pvVar8 + lVar12) = auVar25;
                lVar12 = lVar12 + 0x10;
              }
            }
            pMVar19 = (pointer)((long)&local_78->data + 1);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]) == 2) {
        pMVar19 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar20 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        for (; iVar20 != iVar11; iVar20 = iVar20 + 1) {
          Mat::channel(&local_e0,m,iVar20);
          pvVar7 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,pMVar19 + 1,iVar20);
          pvVar8 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,this_00,iVar20);
          pvVar9 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar12 = 0;
          iVar18 = iVar10;
          while (bVar21 = iVar18 != 0, iVar18 = iVar18 + -1, bVar21) {
            auVar22 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar7 + lVar12),
                                 *(undefined1 (*) [16])((long)pvVar8 + lVar12));
            *(undefined1 (*) [16])((long)pvVar9 + lVar12) = auVar22;
            lVar12 = lVar12 + 0x10;
          }
        }
        for (uVar17 = 2;
            pMVar19 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar17 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar19) /
                            0x48); uVar17 = uVar17 + 1) {
          for (iVar20 = 0; iVar20 != iVar11; iVar20 = iVar20 + 1) {
            Mat::channel(&local_e0,pMVar19 + uVar17,iVar20);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar20);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            iVar18 = iVar10;
            while (bVar21 = iVar18 != 0, iVar18 = iVar18 + -1, bVar21) {
              auVar22 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar8 + lVar12),
                                   *(undefined1 (*) [16])((long)pvVar7 + lVar12));
              *(undefined1 (*) [16])((long)pvVar8 + lVar12) = auVar22;
              lVar12 = lVar12 + 0x10;
            }
          }
        }
      }
    }
    else if (iVar20 == 8) {
      if (iVar18 == 0) {
        local_78 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start + 1;
        pMVar19 = (pointer)0x0;
        iVar20 = 0;
        if (0 < iVar10) {
          iVar20 = iVar10;
        }
        iVar18 = 0;
        if (0 < iVar11) {
          iVar18 = iVar11;
        }
        while (iVar14 = (int)pMVar19, iVar14 != iVar18) {
          in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
          in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
          Mat::channel(&local_e0,m,iVar14);
          pvVar7 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,local_78,iVar14);
          pvVar8 = local_e0.data;
          Mat::~Mat(&local_e0);
          local_98 = pMVar19;
          Mat::channel(&local_e0,this_00,iVar14);
          pvVar9 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar12 = 0;
          iVar14 = iVar20;
          while (bVar21 = iVar14 != 0, iVar14 = iVar14 + -1, bVar21) {
            pfVar1 = (float *)((long)pvVar8 + lVar12);
            pfVar2 = (float *)((long)pvVar7 + lVar12);
            auVar5._4_4_ = pfVar1[1] * pfVar2[1];
            auVar5._0_4_ = *pfVar1 * *pfVar2;
            auVar5._8_4_ = pfVar1[2] * pfVar2[2];
            auVar5._12_4_ = pfVar1[3] * pfVar2[3];
            auVar5._16_4_ = pfVar1[4] * pfVar2[4];
            auVar5._20_4_ = pfVar1[5] * pfVar2[5];
            auVar5._24_4_ = pfVar1[6] * pfVar2[6];
            auVar5._28_4_ = pfVar1[7];
            in_ZMM0 = ZEXT3264(auVar5);
            *(undefined1 (*) [32])((long)pvVar9 + lVar12) = auVar5;
            lVar12 = lVar12 + 0x20;
          }
          pMVar19 = (pointer)(ulong)((int)local_98 + 1);
        }
        pMVar19 = (pointer)0x2;
        while (pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start,
              pMVar19 < (pointer)(((long)(bottom_blobs->
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) /
                                 0x48)) {
          local_98 = pMVar19;
          for (iVar14 = 0; iVar14 != iVar18; iVar14 = iVar14 + 1) {
            in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            Mat::channel(&local_e0,pMVar4 + (long)pMVar19,iVar14);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar14);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            iVar15 = iVar20;
            while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
              pfVar1 = (float *)((long)pvVar7 + lVar12);
              pfVar2 = (float *)((long)pvVar8 + lVar12);
              auVar6._4_4_ = pfVar1[1] * pfVar2[1];
              auVar6._0_4_ = *pfVar1 * *pfVar2;
              auVar6._8_4_ = pfVar1[2] * pfVar2[2];
              auVar6._12_4_ = pfVar1[3] * pfVar2[3];
              auVar6._16_4_ = pfVar1[4] * pfVar2[4];
              auVar6._20_4_ = pfVar1[5] * pfVar2[5];
              auVar6._24_4_ = pfVar1[6] * pfVar2[6];
              auVar6._28_4_ = pfVar1[7];
              in_ZMM0 = ZEXT3264(auVar6);
              *(undefined1 (*) [32])((long)pvVar8 + lVar12) = auVar6;
              lVar12 = lVar12 + 0x20;
            }
          }
          pMVar19 = (pointer)((long)&local_98->data + 1);
        }
        p_Var13 = this->_vptr_Eltwise_x86_avx[-3];
        iVar18 = *(int *)(&this->field_0xd0 + (long)p_Var13);
      }
      if (iVar18 == 1) {
        local_98 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start + 1;
        if (*(int *)(&this->field_0x104 + (long)p_Var13) == 0) {
          iVar20 = 0;
          if (0 < iVar10) {
            iVar20 = iVar10;
          }
          iVar18 = 0;
          iVar14 = 0;
          if (0 < iVar11) {
            iVar18 = iVar11;
            iVar14 = 0;
          }
          for (; iVar14 != iVar18; iVar14 = iVar14 + 1) {
            Mat::channel(&local_e0,m,iVar14);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,local_98,iVar14);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar14);
            pvVar9 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            iVar15 = iVar20;
            while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
              pfVar1 = (float *)((long)pvVar8 + lVar12);
              pfVar2 = (float *)((long)pvVar7 + lVar12);
              auVar30._0_4_ = *pfVar1 + *pfVar2;
              auVar30._4_4_ = pfVar1[1] + pfVar2[1];
              auVar30._8_4_ = pfVar1[2] + pfVar2[2];
              auVar30._12_4_ = pfVar1[3] + pfVar2[3];
              auVar30._16_4_ = pfVar1[4] + pfVar2[4];
              auVar30._20_4_ = pfVar1[5] + pfVar2[5];
              auVar30._24_4_ = pfVar1[6] + pfVar2[6];
              auVar30._28_4_ = pfVar1[7] + pfVar2[7];
              *(undefined1 (*) [32])((long)pvVar9 + lVar12) = auVar30;
              lVar12 = lVar12 + 0x20;
            }
          }
          pMVar19 = (pointer)0x2;
          while (pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                pMVar19 < (pointer)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pMVar4) / 0x48)) {
            local_98 = pMVar19;
            for (iVar14 = 0; iVar14 != iVar18; iVar14 = iVar14 + 1) {
              Mat::channel(&local_e0,pMVar4 + (long)pMVar19,iVar14);
              pvVar7 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,iVar14);
              pvVar8 = local_e0.data;
              Mat::~Mat(&local_e0);
              lVar12 = 0;
              iVar15 = iVar20;
              while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
                pfVar1 = (float *)((long)pvVar7 + lVar12);
                pfVar2 = (float *)((long)pvVar8 + lVar12);
                auVar31._0_4_ = *pfVar1 + *pfVar2;
                auVar31._4_4_ = pfVar1[1] + pfVar2[1];
                auVar31._8_4_ = pfVar1[2] + pfVar2[2];
                auVar31._12_4_ = pfVar1[3] + pfVar2[3];
                auVar31._16_4_ = pfVar1[4] + pfVar2[4];
                auVar31._20_4_ = pfVar1[5] + pfVar2[5];
                auVar31._24_4_ = pfVar1[6] + pfVar2[6];
                auVar31._28_4_ = pfVar1[7] + pfVar2[7];
                *(undefined1 (*) [32])((long)pvVar8 + lVar12) = auVar31;
                lVar12 = lVar12 + 0x20;
              }
            }
            pMVar19 = (pointer)((long)&local_98->data + 1);
          }
        }
        else {
          fStack_70 = **(float **)(&this->field_0xd8 + (long)p_Var13);
          local_58 = (*(float **)(&this->field_0xd8 + (long)p_Var13))[1];
          iVar18 = 0;
          iVar20 = 0;
          if (0 < iVar10) {
            iVar20 = iVar10;
          }
          iVar14 = 0;
          if (0 < iVar11) {
            iVar14 = iVar11;
          }
          local_78 = (pointer)CONCAT44(fStack_70,fStack_70);
          fStack_6c = fStack_70;
          fStack_68 = fStack_70;
          fStack_64 = fStack_70;
          fStack_60 = fStack_70;
          fStack_5c = fStack_70;
          fStack_54 = local_58;
          fStack_50 = local_58;
          fStack_4c = local_58;
          fStack_48 = local_58;
          fStack_44 = local_58;
          fStack_40 = local_58;
          fStack_3c = local_58;
          for (; pMVar16 = local_98, iVar18 != iVar14; iVar18 = iVar18 + 1) {
            in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            Mat::channel(&local_e0,m,iVar18);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,pMVar16,iVar18);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar18);
            pvVar9 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            iVar15 = iVar20;
            while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
              pfVar2 = (float *)((long)pvVar7 + lVar12);
              pfVar1 = (float *)((long)pvVar8 + lVar12);
              auVar32._0_4_ = local_58 * *pfVar1;
              auVar32._4_4_ = fStack_54 * pfVar1[1];
              auVar32._8_4_ = fStack_50 * pfVar1[2];
              auVar32._12_4_ = fStack_4c * pfVar1[3];
              auVar32._16_4_ = fStack_48 * pfVar1[4];
              auVar32._20_4_ = fStack_44 * pfVar1[5];
              auVar32._28_36_ = in_ZMM1._28_36_;
              auVar32._24_4_ = fStack_40 * pfVar1[6];
              auVar28._0_4_ = auVar32._0_4_ + (float)local_78 * *pfVar2;
              auVar28._4_4_ = auVar32._4_4_ + local_78._4_4_ * pfVar2[1];
              auVar28._8_4_ = auVar32._8_4_ + fStack_70 * pfVar2[2];
              auVar28._12_4_ = auVar32._12_4_ + fStack_6c * pfVar2[3];
              auVar28._16_4_ = auVar32._16_4_ + fStack_68 * pfVar2[4];
              auVar28._20_4_ = auVar32._20_4_ + fStack_64 * pfVar2[5];
              auVar28._24_4_ = auVar32._24_4_ + fStack_60 * pfVar2[6];
              auVar28._28_4_ = in_ZMM1._28_4_ + in_ZMM0._28_4_;
              in_ZMM0 = ZEXT3264(auVar28);
              *(undefined1 (*) [32])((long)pvVar9 + lVar12) = auVar28;
              lVar12 = lVar12 + 0x20;
              in_ZMM1 = ZEXT3264(auVar32._0_32_);
            }
          }
          pMVar19 = (pointer)0x2;
          while (pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                pMVar19 < (pointer)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pMVar4) / 0x48)) {
            fStack_90 = *(float *)(*(long *)(&this->field_0xd8 +
                                            (long)this->_vptr_Eltwise_x86_avx[-3]) +
                                  (long)pMVar19 * 4);
            local_98 = (pointer)CONCAT44(fStack_90,fStack_90);
            fStack_8c = fStack_90;
            fStack_88 = fStack_90;
            fStack_84 = fStack_90;
            fStack_80 = fStack_90;
            fStack_7c = fStack_90;
            local_78 = pMVar19;
            for (iVar18 = 0; iVar18 != iVar14; iVar18 = iVar18 + 1) {
              in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
              Mat::channel(&local_e0,pMVar4 + (long)pMVar19,iVar18);
              pvVar7 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,iVar18);
              pvVar8 = local_e0.data;
              Mat::~Mat(&local_e0);
              lVar12 = 0;
              iVar15 = iVar20;
              while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
                pfVar1 = (float *)((long)pvVar7 + lVar12);
                pfVar2 = (float *)((long)pvVar8 + lVar12);
                auVar29._0_4_ = (float)local_98 * *pfVar1 + *pfVar2;
                auVar29._4_4_ = local_98._4_4_ * pfVar1[1] + pfVar2[1];
                auVar29._8_4_ = fStack_90 * pfVar1[2] + pfVar2[2];
                auVar29._12_4_ = fStack_8c * pfVar1[3] + pfVar2[3];
                auVar29._16_4_ = fStack_88 * pfVar1[4] + pfVar2[4];
                auVar29._20_4_ = fStack_84 * pfVar1[5] + pfVar2[5];
                auVar29._24_4_ = fStack_80 * pfVar1[6] + pfVar2[6];
                auVar29._28_4_ = in_ZMM0._28_4_ + pfVar2[7];
                in_ZMM0 = ZEXT3264(auVar29);
                *(undefined1 (*) [32])((long)pvVar8 + lVar12) = auVar29;
                lVar12 = lVar12 + 0x20;
              }
            }
            pMVar19 = (pointer)((long)&local_78->data + 1);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]) == 2) {
        pMVar19 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar20 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        for (; iVar20 != iVar11; iVar20 = iVar20 + 1) {
          Mat::channel(&local_e0,m,iVar20);
          pvVar7 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,pMVar19 + 1,iVar20);
          pvVar8 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,this_00,iVar20);
          pvVar9 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar12 = 0;
          iVar18 = iVar10;
          while (bVar21 = iVar18 != 0, iVar18 = iVar18 + -1, bVar21) {
            auVar5 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar7 + lVar12),
                                *(undefined1 (*) [32])((long)pvVar8 + lVar12));
            *(undefined1 (*) [32])((long)pvVar9 + lVar12) = auVar5;
            lVar12 = lVar12 + 0x20;
          }
        }
        for (uVar17 = 2;
            pMVar19 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar17 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar19) /
                            0x48); uVar17 = uVar17 + 1) {
          for (iVar20 = 0; iVar20 != iVar11; iVar20 = iVar20 + 1) {
            Mat::channel(&local_e0,pMVar19 + uVar17,iVar20);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar20);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            iVar18 = iVar10;
            while (bVar21 = iVar18 != 0, iVar18 = iVar18 + -1, bVar21) {
              auVar5 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar8 + lVar12),
                                  *(undefined1 (*) [32])((long)pvVar7 + lVar12));
              *(undefined1 (*) [32])((long)pvVar8 + lVar12) = auVar5;
              lVar12 = lVar12 + 0x20;
            }
          }
        }
      }
    }
    else {
      if (iVar18 == 0) {
        pMVar19 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar18 = 0;
        iVar20 = 0;
        if (0 < iVar11) {
          iVar20 = iVar11;
        }
        for (; iVar18 != iVar20; iVar18 = iVar18 + 1) {
          Mat::channel(&local_e0,m,iVar18);
          pvVar7 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,pMVar19 + 1,iVar18);
          pvVar8 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,this_00,iVar18);
          pvVar9 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar12 = 0;
          for (iVar14 = iVar10; 0 < iVar14; iVar14 = iVar14 + -1) {
            *(float *)((long)pvVar9 + lVar12) =
                 *(float *)((long)pvVar8 + lVar12) * *(float *)((long)pvVar7 + lVar12);
            lVar12 = lVar12 + 4;
          }
        }
        for (uVar17 = 2;
            pMVar19 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar17 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar19) /
                            0x48); uVar17 = uVar17 + 1) {
          for (iVar18 = 0; iVar18 != iVar20; iVar18 = iVar18 + 1) {
            Mat::channel(&local_e0,pMVar19 + uVar17,iVar18);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar18);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            for (iVar14 = iVar10; 0 < iVar14; iVar14 = iVar14 + -1) {
              *(float *)((long)pvVar8 + lVar12) =
                   *(float *)((long)pvVar8 + lVar12) * *(float *)((long)pvVar7 + lVar12);
              lVar12 = lVar12 + 4;
            }
          }
        }
        p_Var13 = this->_vptr_Eltwise_x86_avx[-3];
        iVar18 = *(int *)(&this->field_0xd0 + (long)p_Var13);
      }
      if (iVar18 == 1) {
        pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + 1;
        if (*(int *)(&this->field_0x104 + (long)p_Var13) == 0) {
          iVar18 = 0;
          iVar20 = 0;
          if (0 < iVar11) {
            iVar20 = iVar11;
          }
          for (; iVar18 != iVar20; iVar18 = iVar18 + 1) {
            Mat::channel(&local_e0,m,iVar18);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,pMVar16,iVar18);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar18);
            pvVar9 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            for (iVar14 = iVar10; 0 < iVar14; iVar14 = iVar14 + -1) {
              *(float *)((long)pvVar9 + lVar12) =
                   *(float *)((long)pvVar8 + lVar12) + *(float *)((long)pvVar7 + lVar12);
              lVar12 = lVar12 + 4;
            }
          }
          for (uVar17 = 2;
              pMVar19 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start,
              uVar17 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar19) /
                              0x48); uVar17 = uVar17 + 1) {
            for (iVar18 = 0; iVar18 != iVar20; iVar18 = iVar18 + 1) {
              Mat::channel(&local_e0,pMVar19 + uVar17,iVar18);
              pvVar7 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,iVar18);
              pvVar8 = local_e0.data;
              Mat::~Mat(&local_e0);
              lVar12 = 0;
              for (iVar14 = iVar10; 0 < iVar14; iVar14 = iVar14 + -1) {
                *(float *)((long)pvVar8 + lVar12) =
                     *(float *)((long)pvVar8 + lVar12) + *(float *)((long)pvVar7 + lVar12);
                lVar12 = lVar12 + 4;
              }
            }
          }
        }
        else {
          iVar18 = 0;
          iVar20 = 0;
          if (0 < iVar11) {
            iVar20 = iVar11;
          }
          local_98 = (pointer)CONCAT44(local_98._4_4_,
                                       **(undefined4 **)(&this->field_0xd8 + (long)p_Var13));
          local_78 = (pointer)CONCAT44(local_78._4_4_,
                                       (*(undefined4 **)(&this->field_0xd8 + (long)p_Var13))[1]);
          for (; iVar18 != iVar20; iVar18 = iVar18 + 1) {
            Mat::channel(&local_e0,m,iVar18);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,pMVar16,iVar18);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar18);
            pvVar9 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            for (iVar14 = iVar10; 0 < iVar14; iVar14 = iVar14 + -1) {
              *(float *)((long)pvVar9 + lVar12) =
                   (float)local_78 * *(float *)((long)pvVar8 + lVar12) +
                   (float)local_98 * *(float *)((long)pvVar7 + lVar12);
              lVar12 = lVar12 + 4;
            }
          }
          pMVar19 = (pointer)0x2;
          while (pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                pMVar19 < (pointer)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pMVar4) / 0x48)) {
            fVar3 = *(float *)(*(long *)(&this->field_0xd8 + (long)this->_vptr_Eltwise_x86_avx[-3])
                              + (long)pMVar19 * 4);
            local_98 = pMVar19;
            for (iVar18 = 0; iVar18 != iVar20; iVar18 = iVar18 + 1) {
              Mat::channel(&local_e0,pMVar4 + (long)pMVar19,iVar18);
              pvVar7 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,iVar18);
              pvVar8 = local_e0.data;
              Mat::~Mat(&local_e0);
              lVar12 = 0;
              for (iVar14 = iVar10; 0 < iVar14; iVar14 = iVar14 + -1) {
                *(float *)((long)pvVar8 + lVar12) =
                     fVar3 * *(float *)((long)pvVar7 + lVar12) + *(float *)((long)pvVar8 + lVar12);
                lVar12 = lVar12 + 4;
              }
            }
            pMVar19 = (pointer)((long)&local_98->data + 1);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]) == 2) {
        pMVar19 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar20 = 0;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        for (; iVar20 != iVar11; iVar20 = iVar20 + 1) {
          Mat::channel(&local_e0,m,iVar20);
          pvVar7 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,pMVar19 + 1,iVar20);
          pvVar8 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,this_00,iVar20);
          pvVar9 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar12 = 0;
          for (iVar18 = iVar10; 0 < iVar18; iVar18 = iVar18 + -1) {
            auVar22 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar8 + lVar12)),
                                 ZEXT416(*(uint *)((long)pvVar7 + lVar12)));
            *(int *)((long)pvVar9 + lVar12) = auVar22._0_4_;
            lVar12 = lVar12 + 4;
          }
        }
        for (uVar17 = 2;
            pMVar19 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar17 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar19) /
                            0x48); uVar17 = uVar17 + 1) {
          for (iVar20 = 0; iVar20 != iVar11; iVar20 = iVar20 + 1) {
            Mat::channel(&local_e0,pMVar19 + uVar17,iVar20);
            pvVar7 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,iVar20);
            pvVar8 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar12 = 0;
            for (iVar18 = iVar10; 0 < iVar18; iVar18 = iVar18 + -1) {
              auVar22 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar8 + lVar12)),
                                   ZEXT416(*(uint *)((long)pvVar7 + lVar12)));
              *(int *)((long)pvVar8 + lVar12) = auVar22._0_4_;
              lVar12 = lVar12 + 4;
            }
          }
        }
      }
    }
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

int Eltwise_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}